

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void CompressTables(lemon *lemp)

{
  state *psVar1;
  rule *prVar2;
  state *psVar3;
  bool bVar4;
  symbol *psVar5;
  action *paVar6;
  action *paVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  action *paVar11;
  long lVar12;
  rule *prVar13;
  
  if (0 < lemp->nstate) {
    lVar12 = 0;
    do {
      psVar1 = lemp->sorted[lVar12];
      paVar6 = psVar1->ap;
      if (paVar6 != (action *)0x0) {
        bVar4 = false;
        iVar8 = 0;
        prVar13 = (rule *)0x0;
        paVar7 = paVar6;
        do {
          if (paVar7->type == REDUCE) {
            prVar2 = (rule *)(paVar7->x).stp;
            if ((prVar2->lhsStart == 0) && (prVar2 != prVar13)) {
              iVar10 = 1;
              for (paVar11 = paVar7->next; paVar11 != (action *)0x0; paVar11 = paVar11->next) {
                if (paVar11->type == REDUCE) {
                  iVar10 = iVar10 + (uint)((rule *)(paVar11->x).stp == prVar2 &&
                                          (rule *)(paVar11->x).stp != prVar13);
                }
              }
              if (iVar8 < iVar10) {
                prVar13 = prVar2;
                iVar8 = iVar10;
              }
            }
          }
          else if ((paVar7->type == SHIFT) && (paVar7->sp == lemp->wildcard)) {
            bVar4 = true;
          }
          paVar7 = paVar7->next;
        } while (paVar7 != (action *)0x0);
        if ((0 < iVar8) && (!bVar4)) {
          while( true ) {
            if (paVar6 == (action *)0x0) {
              __assert_fail("ap",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                            ,0x11f3,"void CompressTables(struct lemon *)");
            }
            if ((paVar6->type == REDUCE) && ((rule *)(paVar6->x).stp == prVar13)) break;
            paVar6 = paVar6->next;
          }
          psVar5 = Symbol_new("{default}");
          paVar6->sp = psVar5;
          for (paVar6 = paVar6->next; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
            if ((paVar6->type == REDUCE) && ((rule *)(paVar6->x).stp == prVar13)) {
              paVar6->type = NOT_USED;
            }
          }
          paVar6 = (action *)msort(psVar1->ap,&psVar1->ap->next,actioncmp);
          psVar1->ap = paVar6;
          for (; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
            if (paVar6->type == REDUCE) {
              if ((rule *)(paVar6->x).stp != prVar13) goto LAB_001082de;
            }
            else if (paVar6->type == SHIFT) goto LAB_001082de;
          }
          psVar1->autoReduce = 1;
          psVar1->pDfltReduce = prVar13;
        }
      }
LAB_001082de:
      lVar12 = lVar12 + 1;
      uVar9 = (ulong)lemp->nstate;
    } while (lVar12 < (long)uVar9);
    if (0 < lemp->nstate) {
      lVar12 = 0;
      do {
        paVar6 = lemp->sorted[lVar12]->ap;
        if (paVar6 != (action *)0x0) {
          do {
            if (((paVar6->type == SHIFT) && (((paVar6->x).stp)->autoReduce != 0)) &&
               (prVar13 = ((paVar6->x).stp)->pDfltReduce, prVar13 != (rule *)0x0)) {
              paVar6->type = SHIFTREDUCE;
              (paVar6->x).stp = (state *)prVar13;
            }
            paVar6 = paVar6->next;
          } while (paVar6 != (action *)0x0);
          uVar9 = (ulong)(uint)lemp->nstate;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)uVar9);
      if (0 < (int)uVar9) {
        lVar12 = 0;
        do {
          psVar1 = lemp->sorted[lVar12];
          paVar6 = psVar1->ap;
          if (paVar6 != (action *)0x0) {
            do {
              paVar7 = paVar6->next;
              if (((paVar6->type == SHIFTREDUCE) &&
                  (psVar3 = (paVar6->x).stp, *(int *)&psVar3[1].cfp != 0)) &&
                 ((*(int *)&psVar3->ap == 1 && (lemp->nterminal <= paVar6->sp->index)))) {
                paVar7 = psVar1->ap;
                while( true ) {
                  if (paVar7 == (action *)0x0) {
                    __assert_fail("ap2!=0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                                  ,0x122c,"void CompressTables(struct lemon *)");
                  }
                  if ((paVar7 != paVar6) && (paVar7->sp == (symbol *)psVar3->bp)) break;
                  paVar7 = paVar7->next;
                }
                paVar6->spOpt = paVar7->sp;
                paVar6->type = paVar7->type;
                paVar6->x = paVar7->x;
                paVar7 = paVar6;
              }
              paVar6 = paVar7;
            } while (paVar6 != (action *)0x0);
            uVar9 = (ulong)(uint)lemp->nstate;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (int)uVar9);
      }
    }
  }
  return;
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2, *nextap;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }

    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possbile
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT ) break;
      if( ap->type==REDUCE && ap->x.rp!=rbest ) break;
    }
    if( ap==0 ){
      stp->autoReduce = 1;
      stp->pDfltReduce = rbest;
    }
  }

  /* Make a second pass over all states and actions.  Convert
  ** every action that is a SHIFT to an autoReduce state into
  ** a SHIFTREDUCE action.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=ap->next){
      struct state *pNextState;
      if( ap->type!=SHIFT ) continue;
      pNextState = ap->x.stp;
      if( pNextState->autoReduce && pNextState->pDfltReduce!=0 ){
        ap->type = SHIFTREDUCE;
        ap->x.rp = pNextState->pDfltReduce;
      }
    }
  }

  /* If a SHIFTREDUCE action specifies a rule that has a single RHS term
  ** (meaning that the SHIFTREDUCE will land back in the state where it
  ** started) and if there is no C-code associated with the reduce action,
  ** then we can go ahead and convert the action to be the same as the
  ** action for the RHS of the rule.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=nextap){
      nextap = ap->next;
      if( ap->type!=SHIFTREDUCE ) continue;
      rp = ap->x.rp;
      if( rp->noCode==0 ) continue;
      if( rp->nrhs!=1 ) continue;
#if 1
      /* Only apply this optimization to non-terminals.  It would be OK to
      ** apply it to terminal symbols too, but that makes the parser tables
      ** larger. */
      if( ap->sp->index<lemp->nterminal ) continue;
#endif
      /* If we reach this point, it means the optimization can be applied */
      nextap = ap;
      for(ap2=stp->ap; ap2 && (ap2==ap || ap2->sp!=rp->lhs); ap2=ap2->next){}
      assert( ap2!=0 );
      ap->spOpt = ap2->sp;
      ap->type = ap2->type;
      ap->x = ap2->x;
    }
  }
}